

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

void absl::lts_20250127::functional_internal::
     InvokeObject<absl::lts_20250127::cord_internal::CordRepBtree::PrependSlow(absl::lts_20250127::cord_internal::CordRepBtree*,absl::lts_20250127::cord_internal::CordRep*)::__0,void,absl::lts_20250127::cord_internal::CordRep*,unsigned_long,unsigned_long>
               (VoidPtr ptr,type args,type_conflict1 args_1,type_conflict1 args_2)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  CordRepBtree *pCVar3;
  
  if (args->length != args_2) {
    if (args_2 == 0) {
      LOCK();
      pRVar1 = &args->refcount;
      uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + -2;
      UNLOCK();
      if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
        __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0xac,
                      "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
      }
      if (uVar2 == 2) {
        cord_internal::CordRep::Destroy(args);
      }
      args = (type)0x0;
    }
    else {
      args = &cord_internal::anon_unknown_0::CreateSubstring(args,args_1,args_2)->super_CordRep;
    }
  }
  pCVar3 = cord_internal::CordRepBtree::
           AddCordRep<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                     ((CordRepBtree *)**ptr.obj,args);
  **ptr.obj = pCVar3;
  return;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}